

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 (*pauVar24) [16];
  undefined4 uVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  ulong uVar29;
  RTCRayQueryContext *pRVar30;
  uint uVar31;
  ulong *puVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  ulong uVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  int *piVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  float fVar51;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  undefined1 auVar49 [64];
  float fVar52;
  float fVar65;
  float fVar66;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar67;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar76;
  undefined1 auVar75 [32];
  float fVar95;
  float fVar97;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar99;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar96;
  float fVar98;
  float fVar100;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar101;
  undefined1 auVar104 [16];
  float fVar112;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar102;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar103 [16];
  float fVar113;
  undefined1 auVar107 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar143 [16];
  float fVar138;
  float fVar152;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  float fVar151;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [64];
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar164 [64];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [64];
  float fVar173;
  undefined1 auVar174 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar175 [64];
  float fVar179;
  float fVar180;
  undefined1 auVar181 [16];
  float fVar188;
  undefined1 auVar182 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar189;
  undefined1 auVar183 [64];
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar191 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2701;
  ulong local_2700;
  ulong local_26f8;
  RayHit *local_26f0;
  RayQueryContext *local_26e8;
  undefined8 local_26e0;
  float fStack_26d8;
  float fStack_26d4;
  long local_26c8;
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  int local_2694;
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  RTCFilterFunctionNArguments local_2670;
  undefined1 local_2640 [16];
  long local_2628;
  Scene *local_2620;
  ulong local_2618;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined4 local_2604;
  undefined4 local_2600;
  undefined4 local_25fc;
  uint local_25f8;
  uint local_25f4;
  uint local_25f0;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [16];
  undefined1 *local_2590;
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [16];
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar28;
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar26 = (undefined1 (*) [16])local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar91 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar90._8_4_ = 0x7fffffff;
    auVar90._0_8_ = 0x7fffffff7fffffff;
    auVar90._12_4_ = 0x7fffffff;
    auVar90 = vandps_avx((undefined1  [16])aVar2,auVar90);
    auVar114._8_4_ = 0x219392ef;
    auVar114._0_8_ = 0x219392ef219392ef;
    auVar114._12_4_ = 0x219392ef;
    auVar90 = vcmpps_avx(auVar90,auVar114,1);
    auVar90 = vblendvps_avx((undefined1  [16])aVar2,auVar114,auVar90);
    uStack_2398 = 0;
    auVar114 = vrcpps_avx(auVar90);
    fVar52 = auVar114._0_4_;
    auVar77._0_4_ = auVar90._0_4_ * fVar52;
    fVar65 = auVar114._4_4_;
    auVar77._4_4_ = auVar90._4_4_ * fVar65;
    fVar15 = auVar114._8_4_;
    auVar77._8_4_ = auVar90._8_4_ * fVar15;
    fVar16 = auVar114._12_4_;
    auVar77._12_4_ = auVar90._12_4_ * fVar16;
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = 0x3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar90 = vsubps_avx(auVar115,auVar77);
    uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar25;
    local_23e0._0_4_ = uVar25;
    local_23e0._8_4_ = uVar25;
    local_23e0._12_4_ = uVar25;
    local_23e0._16_4_ = uVar25;
    local_23e0._20_4_ = uVar25;
    local_23e0._24_4_ = uVar25;
    local_23e0._28_4_ = uVar25;
    auVar159 = ZEXT3264(local_23e0);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar25;
    local_2400._0_4_ = uVar25;
    local_2400._8_4_ = uVar25;
    local_2400._12_4_ = uVar25;
    local_2400._16_4_ = uVar25;
    local_2400._20_4_ = uVar25;
    local_2400._24_4_ = uVar25;
    local_2400._28_4_ = uVar25;
    auVar164 = ZEXT3264(local_2400);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar25;
    local_2420._0_4_ = uVar25;
    local_2420._8_4_ = uVar25;
    local_2420._12_4_ = uVar25;
    local_2420._16_4_ = uVar25;
    local_2420._20_4_ = uVar25;
    local_2420._24_4_ = uVar25;
    local_2420._28_4_ = uVar25;
    auVar169 = ZEXT3264(local_2420);
    auVar78._0_4_ = fVar52 + fVar52 * auVar90._0_4_;
    auVar78._4_4_ = fVar65 + fVar65 * auVar90._4_4_;
    auVar78._8_4_ = fVar15 + fVar15 * auVar90._8_4_;
    auVar78._12_4_ = fVar16 + fVar16 * auVar90._12_4_;
    auVar90 = vshufps_avx(auVar78,auVar78,0);
    local_2440._16_16_ = auVar90;
    local_2440._0_16_ = auVar90;
    auVar175 = ZEXT3264(local_2440);
    auVar90 = vmovshdup_avx(auVar78);
    auVar114 = vshufps_avx(auVar78,auVar78,0x55);
    local_2460._16_16_ = auVar114;
    local_2460._0_16_ = auVar114;
    auVar183 = ZEXT3264(local_2460);
    auVar114 = vshufpd_avx(auVar78,auVar78,1);
    auVar77 = vshufps_avx(auVar78,auVar78,0xaa);
    uVar28 = (ulong)(auVar78._0_4_ < 0.0) << 3;
    local_2480._16_16_ = auVar77;
    local_2480._0_16_ = auVar77;
    auVar191 = ZEXT3264(local_2480);
    uVar39 = (ulong)(auVar90._0_4_ < 0.0) * 8 + 0x10;
    local_2618 = (ulong)(auVar114._0_4_ < 0.0) * 8 + 0x20;
    auVar90 = vshufps_avx(auVar53,auVar53,0);
    local_23c0._16_16_ = auVar90;
    local_23c0._0_16_ = auVar90;
    auVar90 = vshufps_avx(auVar91,auVar91,0);
    auVar49 = ZEXT3264(CONCAT1616(auVar90,auVar90));
    uVar40 = uVar28 ^ 8;
    uVar41 = uVar39 ^ 8;
    uVar42 = local_2618 ^ 8;
    local_25e0 = mm_lookupmask_ps._240_8_;
    uStack_25d8 = mm_lookupmask_ps._248_8_;
    local_26e8 = context;
    local_26f0 = ray;
    local_26f8 = uVar28;
    local_2700 = uVar39;
LAB_014dcf90:
    do {
      pauVar24 = pauVar26 + -1;
      pauVar26 = pauVar26 + -1;
      if (*(float *)(*pauVar24 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar24 = pauVar26;
        uVar35 = *(ulong *)*pauVar26;
        while (pauVar26 = pauVar24, (uVar35 & 8) == 0) {
          uVar29 = uVar35 & 0xfffffffffffffff0;
          puVar32 = (ulong *)(uVar29 + 0x40);
          if (uVar29 == 0) {
            puVar32 = (ulong *)0x0;
          }
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *puVar32;
          auVar79._8_8_ = 0;
          auVar79._0_8_ = puVar32[1];
          auVar90 = vpminub_avx(auVar53,auVar79);
          auVar90 = vpcmpeqb_avx(auVar53,auVar90);
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)((long)puVar32 + 4);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar32 + 0xc);
          auVar53 = vpminub_avx(auVar91,auVar103);
          auVar53 = vpcmpeqb_avx(auVar91,auVar53);
          fVar52 = *(float *)(puVar32 + 6);
          fVar65 = *(float *)((long)puVar32 + 0x3c);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)((long)puVar32 + uVar28);
          auVar91 = vpmovzxbd_avx(auVar80);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)((long)puVar32 + uVar28 + 4);
          auVar114 = vpmovzxbd_avx(auVar122);
          auVar93._16_16_ = auVar114;
          auVar93._0_16_ = auVar91;
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar94._0_4_ = fVar52 + fVar65 * auVar93._0_4_;
          auVar94._4_4_ = fVar52 + fVar65 * auVar93._4_4_;
          auVar94._8_4_ = fVar52 + fVar65 * auVar93._8_4_;
          auVar94._12_4_ = fVar52 + fVar65 * auVar93._12_4_;
          auVar94._16_4_ = fVar52 + fVar65 * auVar93._16_4_;
          auVar94._20_4_ = fVar52 + fVar65 * auVar93._20_4_;
          auVar94._24_4_ = fVar52 + fVar65 * auVar93._24_4_;
          auVar94._28_4_ = fVar52 + auVar93._28_4_;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)((long)puVar32 + uVar40);
          auVar91 = vpmovzxbd_avx(auVar123);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)((long)puVar32 + uVar40 + 4);
          auVar114 = vpmovzxbd_avx(auVar129);
          auVar127._16_16_ = auVar114;
          auVar127._0_16_ = auVar91;
          auVar93 = vcvtdq2ps_avx(auVar127);
          auVar107._0_4_ = fVar52 + fVar65 * auVar93._0_4_;
          auVar107._4_4_ = fVar52 + fVar65 * auVar93._4_4_;
          auVar107._8_4_ = fVar52 + fVar65 * auVar93._8_4_;
          auVar107._12_4_ = fVar52 + fVar65 * auVar93._12_4_;
          auVar107._16_4_ = fVar52 + fVar65 * auVar93._16_4_;
          auVar107._20_4_ = fVar52 + fVar65 * auVar93._20_4_;
          auVar107._24_4_ = fVar52 + fVar65 * auVar93._24_4_;
          auVar107._28_4_ = fVar52 + fVar65;
          fVar52 = *(float *)((long)puVar32 + 0x34);
          fVar65 = *(float *)(puVar32 + 8);
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)((long)puVar32 + uVar39);
          auVar91 = vpmovzxbd_avx(auVar116);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)((long)puVar32 + uVar39 + 4);
          auVar114 = vpmovzxbd_avx(auVar139);
          auVar120._16_16_ = auVar114;
          auVar120._0_16_ = auVar91;
          auVar93 = vcvtdq2ps_avx(auVar120);
          auVar121._0_4_ = fVar52 + fVar65 * auVar93._0_4_;
          auVar121._4_4_ = fVar52 + fVar65 * auVar93._4_4_;
          auVar121._8_4_ = fVar52 + fVar65 * auVar93._8_4_;
          auVar121._12_4_ = fVar52 + fVar65 * auVar93._12_4_;
          auVar121._16_4_ = fVar52 + fVar65 * auVar93._16_4_;
          auVar121._20_4_ = fVar52 + fVar65 * auVar93._20_4_;
          auVar121._24_4_ = fVar52 + fVar65 * auVar93._24_4_;
          auVar121._28_4_ = fVar52 + auVar93._28_4_;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = *(ulong *)((long)puVar32 + uVar41);
          auVar91 = vpmovzxbd_avx(auVar140);
          auVar153._8_8_ = 0;
          auVar153._0_8_ = *(ulong *)((long)puVar32 + uVar41 + 4);
          auVar114 = vpmovzxbd_avx(auVar153);
          auVar147._16_16_ = auVar114;
          auVar147._0_16_ = auVar91;
          auVar93 = vcvtdq2ps_avx(auVar147);
          auVar128._0_4_ = fVar52 + auVar93._0_4_ * fVar65;
          auVar128._4_4_ = fVar52 + auVar93._4_4_ * fVar65;
          auVar128._8_4_ = fVar52 + auVar93._8_4_ * fVar65;
          auVar128._12_4_ = fVar52 + auVar93._12_4_ * fVar65;
          auVar128._16_4_ = fVar52 + auVar93._16_4_ * fVar65;
          auVar128._20_4_ = fVar52 + auVar93._20_4_ * fVar65;
          auVar128._24_4_ = fVar52 + auVar93._24_4_ * fVar65;
          auVar128._28_4_ = fVar52 + fVar65;
          auVar130._8_8_ = 0;
          auVar130._0_8_ = *(ulong *)((long)puVar32 + local_2618);
          auVar91 = vpmovzxbd_avx(auVar130);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)((long)puVar32 + local_2618 + 4);
          auVar114 = vpmovzxbd_avx(auVar141);
          auVar136._16_16_ = auVar114;
          auVar136._0_16_ = auVar91;
          auVar142._8_8_ = 0;
          auVar142._0_8_ = *(ulong *)((long)puVar32 + uVar42);
          auVar91 = vpmovzxbd_avx(auVar142);
          auVar154._8_8_ = 0;
          auVar154._0_8_ = *(ulong *)((long)puVar32 + uVar42 + 4);
          auVar114 = vpmovzxbd_avx(auVar154);
          auVar148._16_16_ = auVar114;
          auVar148._0_16_ = auVar91;
          fVar52 = *(float *)((long)puVar32 + 0x44);
          auVar93 = vcvtdq2ps_avx(auVar136);
          auVar14 = vcvtdq2ps_avx(auVar148);
          fVar65 = *(float *)(puVar32 + 7);
          auVar137._0_4_ = fVar65 + fVar52 * auVar93._0_4_;
          auVar137._4_4_ = fVar65 + fVar52 * auVar93._4_4_;
          auVar137._8_4_ = fVar65 + fVar52 * auVar93._8_4_;
          auVar137._12_4_ = fVar65 + fVar52 * auVar93._12_4_;
          auVar137._16_4_ = fVar65 + fVar52 * auVar93._16_4_;
          auVar137._20_4_ = fVar65 + fVar52 * auVar93._20_4_;
          auVar137._24_4_ = fVar65 + fVar52 * auVar93._24_4_;
          auVar137._28_4_ = fVar65 + auVar93._28_4_;
          auVar149._0_4_ = fVar65 + fVar52 * auVar14._0_4_;
          auVar149._4_4_ = fVar65 + fVar52 * auVar14._4_4_;
          auVar149._8_4_ = fVar65 + fVar52 * auVar14._8_4_;
          auVar149._12_4_ = fVar65 + fVar52 * auVar14._12_4_;
          auVar149._16_4_ = fVar65 + fVar52 * auVar14._16_4_;
          auVar149._20_4_ = fVar65 + fVar52 * auVar14._20_4_;
          auVar149._24_4_ = fVar65 + fVar52 * auVar14._24_4_;
          auVar149._28_4_ = fVar65 + auVar14._28_4_;
          auVar93 = vsubps_avx(auVar94,auVar159._0_32_);
          auVar14._4_4_ = auVar175._4_4_ * auVar93._4_4_;
          auVar14._0_4_ = auVar175._0_4_ * auVar93._0_4_;
          auVar14._8_4_ = auVar175._8_4_ * auVar93._8_4_;
          auVar14._12_4_ = auVar175._12_4_ * auVar93._12_4_;
          auVar14._16_4_ = auVar175._16_4_ * auVar93._16_4_;
          auVar14._20_4_ = auVar175._20_4_ * auVar93._20_4_;
          auVar14._24_4_ = auVar175._24_4_ * auVar93._24_4_;
          auVar14._28_4_ = auVar93._28_4_;
          auVar93 = vsubps_avx(auVar121,auVar164._0_32_);
          auVar18._4_4_ = auVar183._4_4_ * auVar93._4_4_;
          auVar18._0_4_ = auVar183._0_4_ * auVar93._0_4_;
          auVar18._8_4_ = auVar183._8_4_ * auVar93._8_4_;
          auVar18._12_4_ = auVar183._12_4_ * auVar93._12_4_;
          auVar18._16_4_ = auVar183._16_4_ * auVar93._16_4_;
          auVar18._20_4_ = auVar183._20_4_ * auVar93._20_4_;
          auVar18._24_4_ = auVar183._24_4_ * auVar93._24_4_;
          auVar18._28_4_ = auVar93._28_4_;
          auVar93 = vmaxps_avx(auVar14,auVar18);
          auVar14 = vsubps_avx(auVar137,auVar169._0_32_);
          auVar19._4_4_ = auVar191._4_4_ * auVar14._4_4_;
          auVar19._0_4_ = auVar191._0_4_ * auVar14._0_4_;
          auVar19._8_4_ = auVar191._8_4_ * auVar14._8_4_;
          auVar19._12_4_ = auVar191._12_4_ * auVar14._12_4_;
          auVar19._16_4_ = auVar191._16_4_ * auVar14._16_4_;
          auVar19._20_4_ = auVar191._20_4_ * auVar14._20_4_;
          auVar19._24_4_ = auVar191._24_4_ * auVar14._24_4_;
          auVar19._28_4_ = auVar14._28_4_;
          auVar14 = vmaxps_avx(auVar19,local_23c0);
          local_25c0 = vmaxps_avx(auVar93,auVar14);
          auVar93 = vsubps_avx(auVar107,auVar159._0_32_);
          auVar20._4_4_ = auVar175._4_4_ * auVar93._4_4_;
          auVar20._0_4_ = auVar175._0_4_ * auVar93._0_4_;
          auVar20._8_4_ = auVar175._8_4_ * auVar93._8_4_;
          auVar20._12_4_ = auVar175._12_4_ * auVar93._12_4_;
          auVar20._16_4_ = auVar175._16_4_ * auVar93._16_4_;
          auVar20._20_4_ = auVar175._20_4_ * auVar93._20_4_;
          auVar20._24_4_ = auVar175._24_4_ * auVar93._24_4_;
          auVar20._28_4_ = auVar93._28_4_;
          auVar93 = vsubps_avx(auVar128,auVar164._0_32_);
          auVar21._4_4_ = auVar183._4_4_ * auVar93._4_4_;
          auVar21._0_4_ = auVar183._0_4_ * auVar93._0_4_;
          auVar21._8_4_ = auVar183._8_4_ * auVar93._8_4_;
          auVar21._12_4_ = auVar183._12_4_ * auVar93._12_4_;
          auVar21._16_4_ = auVar183._16_4_ * auVar93._16_4_;
          auVar21._20_4_ = auVar183._20_4_ * auVar93._20_4_;
          auVar21._24_4_ = auVar183._24_4_ * auVar93._24_4_;
          auVar21._28_4_ = auVar93._28_4_;
          auVar93 = vminps_avx(auVar20,auVar21);
          auVar14 = vsubps_avx(auVar149,auVar169._0_32_);
          auVar22._4_4_ = auVar191._4_4_ * auVar14._4_4_;
          auVar22._0_4_ = auVar191._0_4_ * auVar14._0_4_;
          auVar22._8_4_ = auVar191._8_4_ * auVar14._8_4_;
          auVar22._12_4_ = auVar191._12_4_ * auVar14._12_4_;
          auVar22._16_4_ = auVar191._16_4_ * auVar14._16_4_;
          auVar22._20_4_ = auVar191._20_4_ * auVar14._20_4_;
          auVar22._24_4_ = auVar191._24_4_ * auVar14._24_4_;
          auVar22._28_4_ = auVar14._28_4_;
          auVar14 = vminps_avx(auVar22,auVar49._0_32_);
          auVar14 = vminps_avx(auVar93,auVar14);
          auVar93 = vcmpps_avx(local_25c0,auVar14,2);
          auVar91 = vpcmpeqd_avx(auVar14._0_16_,auVar14._0_16_);
          auVar90 = vpmovsxbd_avx(auVar90 ^ auVar91);
          auVar53 = vpmovsxbd_avx(auVar53 ^ auVar91);
          auVar64._16_16_ = auVar53;
          auVar64._0_16_ = auVar90;
          auVar14 = vcvtdq2ps_avx(auVar64);
          auVar75._8_4_ = 0xbf800000;
          auVar75._0_8_ = 0xbf800000bf800000;
          auVar75._12_4_ = 0xbf800000;
          auVar75._16_4_ = 0xbf800000;
          auVar75._20_4_ = 0xbf800000;
          auVar75._24_4_ = 0xbf800000;
          auVar75._28_4_ = 0xbf800000;
          auVar14 = vcmpps_avx(auVar75,auVar14,1);
          auVar93 = vandps_avx(auVar93,auVar14);
          uVar31 = vmovmskps_avx(auVar93);
          if (uVar31 == 0) {
            if (pauVar26 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014dcf90;
          }
          uVar31 = uVar31 & 0xff;
          lVar27 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          uVar35 = *(ulong *)(uVar29 + lVar27 * 8);
          uVar31 = uVar31 - 1 & uVar31;
          pauVar24 = pauVar26;
          if (uVar31 != 0) {
            uVar4 = *(uint *)(local_25c0 + lVar27 * 4);
            lVar27 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            uVar33 = *(ulong *)(uVar29 + lVar27 * 8);
            uVar3 = *(uint *)(local_25c0 + lVar27 * 4);
            uVar31 = uVar31 - 1 & uVar31;
            uVar28 = local_26f8;
            uVar39 = local_2700;
            if (uVar31 == 0) {
              pauVar24 = pauVar26 + 1;
              if (uVar4 < uVar3) {
                *(ulong *)*pauVar26 = uVar33;
                *(uint *)(*pauVar26 + 8) = uVar3;
              }
              else {
                *(ulong *)*pauVar26 = uVar35;
                *(uint *)(*pauVar26 + 8) = uVar4;
                uVar35 = uVar33;
              }
            }
            else {
              auVar54._8_8_ = 0;
              auVar54._0_8_ = uVar35;
              auVar90 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar4));
              auVar69._8_8_ = 0;
              auVar69._0_8_ = uVar33;
              auVar53 = vpunpcklqdq_avx(auVar69,ZEXT416(uVar3));
              lVar27 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)(uVar29 + lVar27 * 8);
              auVar91 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_25c0 + lVar27 * 4)));
              uVar31 = uVar31 - 1 & uVar31;
              if (uVar31 == 0) {
                auVar114 = vpcmpgtd_avx(auVar53,auVar90);
                auVar77 = vpshufd_avx(auVar114,0xaa);
                auVar114 = vblendvps_avx(auVar53,auVar90,auVar77);
                auVar90 = vblendvps_avx(auVar90,auVar53,auVar77);
                auVar53 = vpcmpgtd_avx(auVar91,auVar114);
                auVar77 = vpshufd_avx(auVar53,0xaa);
                auVar53 = vblendvps_avx(auVar91,auVar114,auVar77);
                auVar91 = vblendvps_avx(auVar114,auVar91,auVar77);
                auVar114 = vpcmpgtd_avx(auVar91,auVar90);
                auVar77 = vpshufd_avx(auVar114,0xaa);
                auVar114 = vblendvps_avx(auVar91,auVar90,auVar77);
                auVar90 = vblendvps_avx(auVar90,auVar91,auVar77);
                *pauVar26 = auVar90;
                pauVar26[1] = auVar114;
                uVar35 = auVar53._0_8_;
                pauVar24 = pauVar26 + 2;
              }
              else {
                lVar27 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                auVar104._8_8_ = 0;
                auVar104._0_8_ = *(ulong *)(uVar29 + lVar27 * 8);
                auVar114 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_25c0 + lVar27 * 4)));
                uVar31 = uVar31 - 1 & uVar31;
                uVar33 = (ulong)uVar31;
                context = local_26e8;
                ray = local_26f0;
                if (uVar31 == 0) {
                  auVar77 = vpcmpgtd_avx(auVar53,auVar90);
                  auVar78 = vpshufd_avx(auVar77,0xaa);
                  auVar77 = vblendvps_avx(auVar53,auVar90,auVar78);
                  auVar90 = vblendvps_avx(auVar90,auVar53,auVar78);
                  auVar53 = vpcmpgtd_avx(auVar114,auVar91);
                  auVar78 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar114,auVar91,auVar78);
                  auVar91 = vblendvps_avx(auVar91,auVar114,auVar78);
                  auVar114 = vpcmpgtd_avx(auVar91,auVar90);
                  auVar78 = vpshufd_avx(auVar114,0xaa);
                  auVar114 = vblendvps_avx(auVar91,auVar90,auVar78);
                  auVar90 = vblendvps_avx(auVar90,auVar91,auVar78);
                  auVar91 = vpcmpgtd_avx(auVar53,auVar77);
                  auVar78 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar53,auVar77,auVar78);
                  auVar53 = vblendvps_avx(auVar77,auVar53,auVar78);
                  auVar77 = vpcmpgtd_avx(auVar114,auVar53);
                  auVar78 = vpshufd_avx(auVar77,0xaa);
                  auVar77 = vblendvps_avx(auVar114,auVar53,auVar78);
                  auVar53 = vblendvps_avx(auVar53,auVar114,auVar78);
                  *pauVar26 = auVar90;
                  pauVar26[1] = auVar53;
                  pauVar26[2] = auVar77;
                  uVar35 = auVar91._0_8_;
                  pauVar24 = pauVar26 + 3;
                }
                else {
                  *pauVar26 = auVar90;
                  pauVar26[1] = auVar53;
                  pauVar26[2] = auVar91;
                  pauVar26[3] = auVar114;
                  lVar27 = 0x30;
                  do {
                    lVar36 = lVar27;
                    lVar27 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                      }
                    }
                    uVar35 = *(ulong *)(uVar29 + lVar27 * 8);
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar35;
                    auVar90 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_25c0 + lVar27 * 4)));
                    *(undefined1 (*) [16])(pauVar26[1] + lVar36) = auVar90;
                    uVar33 = uVar33 & uVar33 - 1;
                    lVar27 = lVar36 + 0x10;
                  } while (uVar33 != 0);
                  pauVar24 = (undefined1 (*) [16])(pauVar26[1] + lVar36);
                  if (lVar36 + 0x10 != 0) {
                    lVar27 = 0x10;
                    pauVar34 = pauVar26;
                    do {
                      auVar90 = pauVar34[1];
                      pauVar34 = pauVar34 + 1;
                      uVar31 = vextractps_avx(auVar90,2);
                      lVar36 = lVar27;
                      do {
                        if (uVar31 <= *(uint *)(pauVar26[-1] + lVar36 + 8)) {
                          pauVar37 = (undefined1 (*) [16])(*pauVar26 + lVar36);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar26 + lVar36) =
                             *(undefined1 (*) [16])(pauVar26[-1] + lVar36);
                        lVar36 = lVar36 + -0x10;
                        pauVar37 = pauVar26;
                      } while (lVar36 != 0);
                      *pauVar37 = auVar90;
                      lVar27 = lVar27 + 0x10;
                    } while (pauVar24 != pauVar34);
                    uVar35 = *(ulong *)*pauVar24;
                  }
                }
              }
            }
          }
        }
        local_2628 = (ulong)((uint)uVar35 & 0xf) - 8;
        if (local_2628 != 0) {
          uVar35 = uVar35 & 0xfffffffffffffff0;
          local_26c8 = 0;
          do {
            lVar27 = local_26c8 * 0x50;
            local_2620 = context->scene;
            ppfVar5 = (context->scene->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar35 + 0x30 + lVar27)];
            pfVar7 = ppfVar5[*(uint *)(uVar35 + 0x34 + lVar27)];
            pfVar8 = ppfVar5[*(uint *)(uVar35 + 0x38 + lVar27)];
            pfVar9 = ppfVar5[*(uint *)(uVar35 + 0x3c + lVar27)];
            auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar35 + lVar27)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar35 + 8 + lVar27)))
            ;
            auVar90 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar35 + lVar27)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar35 + 8 + lVar27)))
            ;
            auVar114 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar35 + 4 + lVar27))
                                     ,*(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar35 + 0xc + lVar27)));
            auVar53 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar35 + 4 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar35 + 0xc + lVar27)));
            auVar78 = vunpcklps_avx(auVar90,auVar53);
            auVar115 = vunpcklps_avx(auVar91,auVar114);
            auVar90 = vunpckhps_avx(auVar91,auVar114);
            auVar114 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar35 + 0x10 + lVar27)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar35 + 0x18 + lVar27)));
            auVar53 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar35 + 0x10 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar35 + 0x18 + lVar27)));
            auVar77 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar35 + 0x14 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar35 + 0x1c + lVar27)));
            auVar91 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar35 + 0x14 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar35 + 0x1c + lVar27)));
            auVar79 = vunpcklps_avx(auVar53,auVar91);
            auVar80 = vunpcklps_avx(auVar114,auVar77);
            auVar53 = vunpckhps_avx(auVar114,auVar77);
            auVar77 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar35 + 0x20 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar35 + 0x28 + lVar27)));
            auVar91 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar35 + 0x20 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar35 + 0x28 + lVar27)));
            auVar103 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar35 + 0x24 + lVar27)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar35 + 0x2c + lVar27)));
            auVar114 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar35 + 0x24 + lVar27)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar35 + 0x2c + lVar27)));
            auVar116 = vunpcklps_avx(auVar91,auVar114);
            auVar114 = vunpcklps_avx(auVar77,auVar103);
            auVar77 = vunpckhps_avx(auVar77,auVar103);
            puVar1 = (undefined8 *)(uVar35 + 0x30 + lVar27);
            local_2490 = *puVar1;
            uStack_2488 = puVar1[1];
            puVar1 = (undefined8 *)(uVar35 + 0x40 + lVar27);
            local_25d0 = *puVar1;
            uStack_25c8 = puVar1[1];
            uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar155._4_4_ = uVar25;
            auVar155._0_4_ = uVar25;
            auVar155._8_4_ = uVar25;
            auVar155._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar174._4_4_ = uVar25;
            auVar174._0_4_ = uVar25;
            auVar174._8_4_ = uVar25;
            auVar174._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar181._4_4_ = uVar25;
            auVar181._0_4_ = uVar25;
            auVar181._8_4_ = uVar25;
            auVar181._12_4_ = uVar25;
            local_2680 = vsubps_avx(auVar115,auVar155);
            local_2640 = vsubps_avx(auVar90,auVar174);
            local_24a0 = vsubps_avx(auVar78,auVar181);
            auVar90 = vsubps_avx(auVar80,auVar155);
            auVar53 = vsubps_avx(auVar53,auVar174);
            auVar91 = vsubps_avx(auVar79,auVar181);
            auVar114 = vsubps_avx(auVar114,auVar155);
            auVar77 = vsubps_avx(auVar77,auVar174);
            auVar78 = vsubps_avx(auVar116,auVar181);
            local_24b0 = vsubps_avx(auVar114,local_2680);
            local_24c0 = vsubps_avx(auVar77,local_2640);
            local_24d0 = vsubps_avx(auVar78,local_24a0);
            fVar15 = local_2640._0_4_;
            fVar52 = auVar77._0_4_ + fVar15;
            fVar96 = local_2640._4_4_;
            fVar65 = auVar77._4_4_ + fVar96;
            fVar100 = local_2640._8_4_;
            fVar66 = auVar77._8_4_ + fVar100;
            fVar12 = local_2640._12_4_;
            fVar67 = auVar77._12_4_ + fVar12;
            fVar158 = local_24a0._0_4_;
            fVar101 = fVar158 + auVar78._0_4_;
            fVar160 = local_24a0._4_4_;
            fVar108 = fVar160 + auVar78._4_4_;
            fVar161 = local_24a0._8_4_;
            fVar110 = fVar161 + auVar78._8_4_;
            fVar162 = local_24a0._12_4_;
            fVar112 = fVar162 + auVar78._12_4_;
            fVar68 = local_24d0._0_4_;
            auVar143._0_4_ = fVar68 * fVar52;
            fVar76 = local_24d0._4_4_;
            auVar143._4_4_ = fVar76 * fVar65;
            fVar50 = local_24d0._8_4_;
            auVar143._8_4_ = fVar50 * fVar66;
            fVar51 = local_24d0._12_4_;
            auVar143._12_4_ = fVar51 * fVar67;
            fVar190 = local_24c0._0_4_;
            auVar156._0_4_ = fVar190 * fVar101;
            fVar192 = local_24c0._4_4_;
            auVar156._4_4_ = fVar192 * fVar108;
            fVar193 = local_24c0._8_4_;
            auVar156._8_4_ = fVar193 * fVar110;
            fVar194 = local_24c0._12_4_;
            auVar156._12_4_ = fVar194 * fVar112;
            auVar115 = vsubps_avx(auVar156,auVar143);
            fVar16 = local_2680._0_4_;
            fVar138 = auVar114._0_4_ + fVar16;
            fVar98 = local_2680._4_4_;
            fVar150 = auVar114._4_4_ + fVar98;
            fVar11 = local_2680._8_4_;
            fVar151 = auVar114._8_4_ + fVar11;
            fVar13 = local_2680._12_4_;
            fVar152 = auVar114._12_4_ + fVar13;
            fVar179 = local_24b0._0_4_;
            auVar105._0_4_ = fVar179 * fVar101;
            fVar184 = local_24b0._4_4_;
            auVar105._4_4_ = fVar184 * fVar108;
            fVar186 = local_24b0._8_4_;
            auVar105._8_4_ = fVar186 * fVar110;
            fVar188 = local_24b0._12_4_;
            auVar105._12_4_ = fVar188 * fVar112;
            auVar157._0_4_ = fVar138 * fVar68;
            auVar157._4_4_ = fVar150 * fVar76;
            auVar157._8_4_ = fVar151 * fVar50;
            auVar157._12_4_ = fVar152 * fVar51;
            auVar79 = vsubps_avx(auVar157,auVar105);
            auVar144._0_4_ = fVar190 * fVar138;
            auVar144._4_4_ = fVar192 * fVar150;
            auVar144._8_4_ = fVar193 * fVar151;
            auVar144._12_4_ = fVar194 * fVar152;
            auVar43._0_4_ = fVar179 * fVar52;
            auVar43._4_4_ = fVar184 * fVar65;
            auVar43._8_4_ = fVar186 * fVar66;
            auVar43._12_4_ = fVar188 * fVar67;
            auVar80 = vsubps_avx(auVar43,auVar144);
            local_26e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar52 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar65 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_24f0._0_4_ =
                 auVar115._0_4_ * fVar65 + fVar52 * auVar79._0_4_ + local_26e0._4_4_ * auVar80._0_4_
            ;
            local_24f0._4_4_ =
                 auVar115._4_4_ * fVar65 + fVar52 * auVar79._4_4_ + local_26e0._4_4_ * auVar80._4_4_
            ;
            local_24f0._8_4_ =
                 auVar115._8_4_ * fVar65 + fVar52 * auVar79._8_4_ + local_26e0._4_4_ * auVar80._8_4_
            ;
            local_24f0._12_4_ =
                 auVar115._12_4_ * fVar65 +
                 fVar52 * auVar79._12_4_ + local_26e0._4_4_ * auVar80._12_4_;
            local_24e0 = vsubps_avx(local_2640,auVar53);
            auVar115 = vsubps_avx(local_24a0,auVar91);
            fVar66 = fVar15 + auVar53._0_4_;
            fVar67 = fVar96 + auVar53._4_4_;
            fVar101 = fVar100 + auVar53._8_4_;
            fVar108 = fVar12 + auVar53._12_4_;
            fVar110 = fVar158 + auVar91._0_4_;
            fVar112 = fVar160 + auVar91._4_4_;
            fVar138 = fVar161 + auVar91._8_4_;
            fVar150 = fVar162 + auVar91._12_4_;
            fVar163 = auVar115._0_4_;
            auVar182._0_4_ = fVar163 * fVar66;
            fVar165 = auVar115._4_4_;
            auVar182._4_4_ = fVar165 * fVar67;
            fVar166 = auVar115._8_4_;
            auVar182._8_4_ = fVar166 * fVar101;
            fVar167 = auVar115._12_4_;
            auVar182._12_4_ = fVar167 * fVar108;
            fVar173 = local_24e0._0_4_;
            auVar82._0_4_ = fVar173 * fVar110;
            fVar176 = local_24e0._4_4_;
            auVar82._4_4_ = fVar176 * fVar112;
            fVar177 = local_24e0._8_4_;
            auVar82._8_4_ = fVar177 * fVar138;
            fVar178 = local_24e0._12_4_;
            auVar82._12_4_ = fVar178 * fVar150;
            auVar115 = vsubps_avx(auVar82,auVar182);
            auVar79 = vsubps_avx(local_2680,auVar90);
            fVar180 = auVar79._0_4_;
            auVar106._0_4_ = fVar180 * fVar110;
            fVar185 = auVar79._4_4_;
            auVar106._4_4_ = fVar185 * fVar112;
            fVar187 = auVar79._8_4_;
            auVar106._8_4_ = fVar187 * fVar138;
            fVar189 = auVar79._12_4_;
            auVar106._12_4_ = fVar189 * fVar150;
            fVar110 = fVar16 + auVar90._0_4_;
            fVar112 = fVar98 + auVar90._4_4_;
            fVar138 = fVar11 + auVar90._8_4_;
            fVar150 = fVar13 + auVar90._12_4_;
            auVar145._0_4_ = fVar163 * fVar110;
            auVar145._4_4_ = fVar165 * fVar112;
            auVar145._8_4_ = fVar166 * fVar138;
            auVar145._12_4_ = fVar167 * fVar150;
            auVar79 = vsubps_avx(auVar145,auVar106);
            auVar131._0_4_ = fVar173 * fVar110;
            auVar131._4_4_ = fVar176 * fVar112;
            auVar131._8_4_ = fVar177 * fVar138;
            auVar131._12_4_ = fVar178 * fVar150;
            auVar44._0_4_ = fVar180 * fVar66;
            auVar44._4_4_ = fVar185 * fVar67;
            auVar44._8_4_ = fVar187 * fVar101;
            auVar44._12_4_ = fVar189 * fVar108;
            auVar80 = vsubps_avx(auVar44,auVar131);
            local_25c0._16_4_ =
                 fVar65 * auVar115._0_4_ + fVar52 * auVar79._0_4_ + local_26e0._4_4_ * auVar80._0_4_
            ;
            local_25c0._20_4_ =
                 fVar65 * auVar115._4_4_ + fVar52 * auVar79._4_4_ + local_26e0._4_4_ * auVar80._4_4_
            ;
            local_25c0._24_4_ =
                 fVar65 * auVar115._8_4_ + fVar52 * auVar79._8_4_ + local_26e0._4_4_ * auVar80._8_4_
            ;
            local_25c0._28_4_ =
                 fVar65 * auVar115._12_4_ +
                 fVar52 * auVar79._12_4_ + local_26e0._4_4_ * auVar80._12_4_;
            auVar115 = vsubps_avx(auVar90,auVar114);
            fVar152 = auVar114._0_4_ + auVar90._0_4_;
            fVar95 = auVar114._4_4_ + auVar90._4_4_;
            fVar97 = auVar114._8_4_ + auVar90._8_4_;
            fVar99 = auVar114._12_4_ + auVar90._12_4_;
            auVar90 = vsubps_avx(auVar53,auVar77);
            fVar112 = auVar53._0_4_ + auVar77._0_4_;
            fVar138 = auVar53._4_4_ + auVar77._4_4_;
            fVar150 = auVar53._8_4_ + auVar77._8_4_;
            fVar151 = auVar53._12_4_ + auVar77._12_4_;
            auVar53 = vsubps_avx(auVar91,auVar78);
            fVar67 = auVar91._0_4_ + auVar78._0_4_;
            fVar101 = auVar91._4_4_ + auVar78._4_4_;
            fVar108 = auVar91._8_4_ + auVar78._8_4_;
            fVar110 = auVar91._12_4_ + auVar78._12_4_;
            fVar102 = auVar53._0_4_;
            auVar117._0_4_ = fVar102 * fVar112;
            fVar109 = auVar53._4_4_;
            auVar117._4_4_ = fVar109 * fVar138;
            fVar111 = auVar53._8_4_;
            auVar117._8_4_ = fVar111 * fVar150;
            fVar113 = auVar53._12_4_;
            auVar117._12_4_ = fVar113 * fVar151;
            fVar168 = auVar90._0_4_;
            auVar132._0_4_ = fVar168 * fVar67;
            fVar170 = auVar90._4_4_;
            auVar132._4_4_ = fVar170 * fVar101;
            fVar171 = auVar90._8_4_;
            auVar132._8_4_ = fVar171 * fVar108;
            fVar172 = auVar90._12_4_;
            auVar132._12_4_ = fVar172 * fVar110;
            auVar90 = vsubps_avx(auVar132,auVar117);
            fVar66 = auVar115._0_4_;
            auVar56._0_4_ = fVar66 * fVar67;
            fVar67 = auVar115._4_4_;
            auVar56._4_4_ = fVar67 * fVar101;
            fVar101 = auVar115._8_4_;
            auVar56._8_4_ = fVar101 * fVar108;
            fVar108 = auVar115._12_4_;
            auVar56._12_4_ = fVar108 * fVar110;
            auVar133._0_4_ = fVar102 * fVar152;
            auVar133._4_4_ = fVar109 * fVar95;
            auVar133._8_4_ = fVar111 * fVar97;
            auVar133._12_4_ = fVar113 * fVar99;
            auVar53 = vsubps_avx(auVar133,auVar56);
            auVar83._0_4_ = fVar168 * fVar152;
            auVar83._4_4_ = fVar170 * fVar95;
            auVar83._8_4_ = fVar171 * fVar97;
            auVar83._12_4_ = fVar172 * fVar99;
            auVar70._0_4_ = fVar66 * fVar112;
            auVar70._4_4_ = fVar67 * fVar138;
            auVar70._8_4_ = fVar101 * fVar150;
            auVar70._12_4_ = fVar108 * fVar151;
            auVar91 = vsubps_avx(auVar70,auVar83);
            local_26e0._0_4_ = (uint)local_26e0._4_4_;
            fStack_26d8 = local_26e0._4_4_;
            fStack_26d4 = local_26e0._4_4_;
            auVar57._0_4_ =
                 fVar65 * auVar90._0_4_ + fVar52 * auVar53._0_4_ + local_26e0._4_4_ * auVar91._0_4_;
            auVar57._4_4_ =
                 fVar65 * auVar90._4_4_ + fVar52 * auVar53._4_4_ + local_26e0._4_4_ * auVar91._4_4_;
            auVar57._8_4_ =
                 fVar65 * auVar90._8_4_ + fVar52 * auVar53._8_4_ + local_26e0._4_4_ * auVar91._8_4_;
            auVar57._12_4_ =
                 fVar65 * auVar90._12_4_ +
                 fVar52 * auVar53._12_4_ + local_26e0._4_4_ * auVar91._12_4_;
            local_25a0._0_4_ = auVar57._0_4_ + local_24f0._0_4_ + local_25c0._16_4_;
            local_25a0._4_4_ = auVar57._4_4_ + local_24f0._4_4_ + local_25c0._20_4_;
            local_25a0._8_4_ = auVar57._8_4_ + local_24f0._8_4_ + local_25c0._24_4_;
            local_25a0._12_4_ = auVar57._12_4_ + local_24f0._12_4_ + local_25c0._28_4_;
            auVar90 = vminps_avx(local_24f0,local_25c0._16_16_);
            auVar90 = vminps_avx(auVar90,auVar57);
            auVar84._8_4_ = 0x7fffffff;
            auVar84._0_8_ = 0x7fffffff7fffffff;
            auVar84._12_4_ = 0x7fffffff;
            local_2500 = vandps_avx(local_25a0,auVar84);
            auVar85._0_4_ = local_2500._0_4_ * 1.1920929e-07;
            auVar85._4_4_ = local_2500._4_4_ * 1.1920929e-07;
            auVar85._8_4_ = local_2500._8_4_ * 1.1920929e-07;
            auVar85._12_4_ = local_2500._12_4_ * 1.1920929e-07;
            uVar28 = CONCAT44(auVar85._4_4_,auVar85._0_4_);
            auVar118._0_8_ = uVar28 ^ 0x8000000080000000;
            auVar118._8_4_ = -auVar85._8_4_;
            auVar118._12_4_ = -auVar85._12_4_;
            auVar90 = vcmpps_avx(auVar90,auVar118,5);
            auVar53 = vmaxps_avx(local_24f0,local_25c0._16_16_);
            auVar53 = vmaxps_avx(auVar53,auVar57);
            auVar53 = vcmpps_avx(auVar53,auVar85,2);
            local_2510 = vorps_avx(auVar90,auVar53);
            local_2701 = 0;
            auVar17._8_8_ = uStack_25d8;
            auVar17._0_8_ = local_25e0;
            auVar17 = auVar17 & local_2510;
            if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar17[0xf] < '\0') {
              auVar58._0_4_ = fVar68 * fVar173;
              auVar58._4_4_ = fVar76 * fVar176;
              auVar58._8_4_ = fVar50 * fVar177;
              auVar58._12_4_ = fVar51 * fVar178;
              auVar71._0_4_ = fVar190 * fVar163;
              auVar71._4_4_ = fVar192 * fVar165;
              auVar71._8_4_ = fVar193 * fVar166;
              auVar71._12_4_ = fVar194 * fVar167;
              auVar91 = vsubps_avx(auVar71,auVar58);
              auVar86._0_4_ = fVar163 * fVar168;
              auVar86._4_4_ = fVar165 * fVar170;
              auVar86._8_4_ = fVar166 * fVar171;
              auVar86._12_4_ = fVar167 * fVar172;
              auVar119._0_4_ = fVar173 * fVar102;
              auVar119._4_4_ = fVar176 * fVar109;
              auVar119._8_4_ = fVar177 * fVar111;
              auVar119._12_4_ = fVar178 * fVar113;
              auVar114 = vsubps_avx(auVar119,auVar86);
              auVar134._8_4_ = 0x7fffffff;
              auVar134._0_8_ = 0x7fffffff7fffffff;
              auVar134._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx(auVar58,auVar134);
              auVar53 = vandps_avx(auVar86,auVar134);
              auVar90 = vcmpps_avx(auVar90,auVar53,1);
              local_2540 = vblendvps_avx(auVar114,auVar91,auVar90);
              auVar59._0_4_ = fVar180 * fVar102;
              auVar59._4_4_ = fVar185 * fVar109;
              auVar59._8_4_ = fVar187 * fVar111;
              auVar59._12_4_ = fVar189 * fVar113;
              auVar72._0_4_ = fVar68 * fVar180;
              auVar72._4_4_ = fVar76 * fVar185;
              auVar72._8_4_ = fVar50 * fVar187;
              auVar72._12_4_ = fVar51 * fVar189;
              auVar87._0_4_ = fVar179 * fVar163;
              auVar87._4_4_ = fVar184 * fVar165;
              auVar87._8_4_ = fVar186 * fVar166;
              auVar87._12_4_ = fVar188 * fVar167;
              auVar91 = vsubps_avx(auVar72,auVar87);
              auVar124._0_4_ = fVar163 * fVar66;
              auVar124._4_4_ = fVar165 * fVar67;
              auVar124._8_4_ = fVar166 * fVar101;
              auVar124._12_4_ = fVar167 * fVar108;
              auVar114 = vsubps_avx(auVar124,auVar59);
              auVar90 = vandps_avx(auVar87,auVar134);
              auVar53 = vandps_avx(auVar59,auVar134);
              auVar90 = vcmpps_avx(auVar90,auVar53,1);
              local_2530 = vblendvps_avx(auVar114,auVar91,auVar90);
              auVar45._0_4_ = fVar173 * fVar66;
              auVar45._4_4_ = fVar176 * fVar67;
              auVar45._8_4_ = fVar177 * fVar101;
              auVar45._12_4_ = fVar178 * fVar108;
              auVar73._0_4_ = fVar179 * fVar173;
              auVar73._4_4_ = fVar184 * fVar176;
              auVar73._8_4_ = fVar186 * fVar177;
              auVar73._12_4_ = fVar188 * fVar178;
              auVar88._0_4_ = fVar190 * fVar180;
              auVar88._4_4_ = fVar192 * fVar185;
              auVar88._8_4_ = fVar193 * fVar187;
              auVar88._12_4_ = fVar194 * fVar189;
              auVar125._0_4_ = fVar180 * fVar168;
              auVar125._4_4_ = fVar185 * fVar170;
              auVar125._8_4_ = fVar187 * fVar171;
              auVar125._12_4_ = fVar189 * fVar172;
              auVar91 = vsubps_avx(auVar73,auVar88);
              auVar114 = vsubps_avx(auVar125,auVar45);
              auVar90 = vandps_avx(auVar88,auVar134);
              auVar53 = vandps_avx(auVar45,auVar134);
              auVar90 = vcmpps_avx(auVar90,auVar53,1);
              local_2520 = vblendvps_avx(auVar114,auVar91,auVar90);
              fVar68 = local_2540._0_4_ * fVar65 +
                       local_2530._0_4_ * fVar52 + local_2520._0_4_ * local_26e0._4_4_;
              fVar66 = local_2540._4_4_ * fVar65 +
                       local_2530._4_4_ * fVar52 + local_2520._4_4_ * local_26e0._4_4_;
              fVar76 = local_2540._8_4_ * fVar65 +
                       local_2530._8_4_ * fVar52 + local_2520._8_4_ * local_26e0._4_4_;
              fVar52 = local_2540._12_4_ * fVar65 +
                       local_2530._12_4_ * fVar52 + local_2520._12_4_ * local_26e0._4_4_;
              auVar74._0_4_ = fVar68 + fVar68;
              auVar74._4_4_ = fVar66 + fVar66;
              auVar74._8_4_ = fVar76 + fVar76;
              auVar74._12_4_ = fVar52 + fVar52;
              fVar68 = local_2540._0_4_ * fVar16 +
                       local_2530._0_4_ * fVar15 + local_2520._0_4_ * fVar158;
              fVar96 = local_2540._4_4_ * fVar98 +
                       local_2530._4_4_ * fVar96 + local_2520._4_4_ * fVar160;
              fVar98 = local_2540._8_4_ * fVar11 +
                       local_2530._8_4_ * fVar100 + local_2520._8_4_ * fVar161;
              fVar100 = local_2540._12_4_ * fVar13 +
                        local_2530._12_4_ * fVar12 + local_2520._12_4_ * fVar162;
              auVar90 = vrcpps_avx(auVar74);
              fVar52 = auVar90._0_4_;
              auVar135._0_4_ = auVar74._0_4_ * fVar52;
              fVar65 = auVar90._4_4_;
              auVar135._4_4_ = auVar74._4_4_ * fVar65;
              fVar15 = auVar90._8_4_;
              auVar135._8_4_ = auVar74._8_4_ * fVar15;
              fVar16 = auVar90._12_4_;
              auVar135._12_4_ = auVar74._12_4_ * fVar16;
              auVar146._8_4_ = 0x3f800000;
              auVar146._0_8_ = 0x3f8000003f800000;
              auVar146._12_4_ = 0x3f800000;
              auVar90 = vsubps_avx(auVar146,auVar135);
              local_26b0._0_4_ = (fVar68 + fVar68) * (fVar52 + fVar52 * auVar90._0_4_);
              local_26b0._4_4_ = (fVar96 + fVar96) * (fVar65 + fVar65 * auVar90._4_4_);
              local_26b0._8_4_ = (fVar98 + fVar98) * (fVar15 + fVar15 * auVar90._8_4_);
              local_26b0._12_4_ = (fVar100 + fVar100) * (fVar16 + fVar16 * auVar90._12_4_);
              uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar89._4_4_ = uVar25;
              auVar89._0_4_ = uVar25;
              auVar89._8_4_ = uVar25;
              auVar89._12_4_ = uVar25;
              auVar90 = vcmpps_avx(auVar89,local_26b0,2);
              fVar52 = (ray->super_RayK<1>).tfar;
              auVar126._4_4_ = fVar52;
              auVar126._0_4_ = fVar52;
              auVar126._8_4_ = fVar52;
              auVar126._12_4_ = fVar52;
              auVar53 = vcmpps_avx(local_26b0,auVar126,2);
              auVar90 = vandps_avx(auVar90,auVar53);
              auVar53 = vcmpps_avx(auVar74,_DAT_01f7aa10,4);
              auVar90 = vandps_avx(auVar53,auVar90);
              auVar23._8_8_ = uStack_25d8;
              auVar23._0_8_ = local_25e0;
              auVar53 = vandps_avx(local_2510,auVar23);
              auVar90 = vpslld_avx(auVar90,0x1f);
              auVar91 = vpsrad_avx(auVar90,0x1f);
              auVar90 = auVar53 & auVar91;
              if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar90[0xf] < '\0') {
                local_26c0._0_4_ = (ray->super_RayK<1>).tfar;
                local_26c0._4_4_ = (ray->super_RayK<1>).mask;
                local_26c0._8_4_ = (ray->super_RayK<1>).id;
                local_26c0._12_4_ = (ray->super_RayK<1>).flags;
                auVar53 = vandps_avx(auVar91,auVar53);
                local_25c0._0_16_ = local_24f0;
                local_2590 = &local_2701;
                local_2580 = auVar53;
                local_2550 = local_26b0;
                local_2690 = auVar53;
                auVar90 = vrcpps_avx(local_25a0);
                fVar52 = auVar90._0_4_;
                auVar60._0_4_ = local_25a0._0_4_ * fVar52;
                fVar65 = auVar90._4_4_;
                auVar60._4_4_ = local_25a0._4_4_ * fVar65;
                fVar15 = auVar90._8_4_;
                auVar60._8_4_ = local_25a0._8_4_ * fVar15;
                fVar16 = auVar90._12_4_;
                auVar60._12_4_ = local_25a0._12_4_ * fVar16;
                auVar92._8_4_ = 0x3f800000;
                auVar92._0_8_ = 0x3f8000003f800000;
                auVar92._12_4_ = 0x3f800000;
                auVar90 = vsubps_avx(auVar92,auVar60);
                auVar46._0_4_ = fVar52 + fVar52 * auVar90._0_4_;
                auVar46._4_4_ = fVar65 + fVar65 * auVar90._4_4_;
                auVar46._8_4_ = fVar15 + fVar15 * auVar90._8_4_;
                auVar46._12_4_ = fVar16 + fVar16 * auVar90._12_4_;
                auVar61._8_4_ = 0x219392ef;
                auVar61._0_8_ = 0x219392ef219392ef;
                auVar61._12_4_ = 0x219392ef;
                auVar90 = vcmpps_avx(local_2500,auVar61,5);
                auVar90 = vandps_avx(auVar90,auVar46);
                auVar62._0_4_ = local_24f0._0_4_ * auVar90._0_4_;
                auVar62._4_4_ = local_24f0._4_4_ * auVar90._4_4_;
                auVar62._8_4_ = local_24f0._8_4_ * auVar90._8_4_;
                auVar62._12_4_ = local_24f0._12_4_ * auVar90._12_4_;
                local_2570 = vminps_avx(auVar62,auVar92);
                auVar47._0_4_ = local_25c0._16_4_ * auVar90._0_4_;
                auVar47._4_4_ = local_25c0._20_4_ * auVar90._4_4_;
                auVar47._8_4_ = local_25c0._24_4_ * auVar90._8_4_;
                auVar47._12_4_ = local_25c0._28_4_ * auVar90._12_4_;
                local_2560 = vminps_avx(auVar47,auVar92);
                auVar48._8_4_ = 0x7f800000;
                auVar48._0_8_ = 0x7f8000007f800000;
                auVar48._12_4_ = 0x7f800000;
                auVar90 = vblendvps_avx(auVar48,local_26b0,auVar53);
                auVar91 = vshufps_avx(auVar90,auVar90,0xb1);
                auVar91 = vminps_avx(auVar91,auVar90);
                auVar114 = vshufpd_avx(auVar91,auVar91,1);
                auVar91 = vminps_avx(auVar114,auVar91);
                auVar90 = vcmpps_avx(auVar90,auVar91,0);
                auVar91 = auVar53 & auVar90;
                if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar91[0xf] < '\0') {
                  auVar53 = vandps_avx(auVar90,auVar53);
                }
                uVar31 = vextractps_avx(local_26c0,1);
                uVar25 = vmovmskps_avx(auVar53);
                uVar28 = CONCAT44((int)((ulong)&local_2701 >> 0x20),uVar25);
                piVar38 = (int *)0x0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> (long)piVar38 & 1) == 0; piVar38 = (int *)((long)piVar38 + 1)) {
                  }
                }
                do {
                  uVar4 = *(uint *)((long)&local_2490 + (long)piVar38 * 4);
                  pGVar10 = (local_2620->geometries).items[uVar4].ptr;
                  if ((pGVar10->mask & uVar31) == 0) {
                    *(undefined4 *)(local_2690 + (long)piVar38 * 4) = 0;
                  }
                  else {
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar30 = context->user;
                      if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar52 = *(float *)(local_2570 + (long)piVar38 * 4);
                        fVar65 = *(float *)(local_2560 + (long)piVar38 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2550 + (long)piVar38 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2540 + (long)piVar38 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2530 + (long)piVar38 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_2520 + (long)piVar38 * 4);
                        ray->u = fVar52;
                        ray->v = fVar65;
                        ray->primID = *(uint *)((long)&local_25d0 + (long)piVar38 * 4);
                        ray->geomID = uVar4;
                        ray->instID[0] = pRVar30->instID[0];
                        ray->instPrimID[0] = pRVar30->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar30 = context->user;
                    }
                    local_26e0 = (byte *)context->args;
                    local_2610 = *(undefined4 *)(local_2540 + (long)piVar38 * 4);
                    local_260c = *(undefined4 *)(local_2530 + (long)piVar38 * 4);
                    local_2608 = *(undefined4 *)(local_2520 + (long)piVar38 * 4);
                    local_2604 = *(undefined4 *)(local_2570 + (long)piVar38 * 4);
                    local_2600 = *(undefined4 *)(local_2560 + (long)piVar38 * 4);
                    local_25fc = *(undefined4 *)((long)&local_25d0 + (long)piVar38 * 4);
                    local_25f8 = uVar4;
                    local_25f4 = pRVar30->instID[0];
                    local_25f0 = pRVar30->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2550 + (long)piVar38 * 4);
                    local_2694 = -1;
                    local_2670.valid = &local_2694;
                    local_2670.geometryUserPtr = pGVar10->userPtr;
                    local_2670.context = pRVar30;
                    local_2670.ray = (RTCRayN *)ray;
                    local_2670.hit = (RTCHitN *)&local_2610;
                    local_2670.N = 1;
                    local_2640._0_8_ = pGVar10;
                    local_2680._0_8_ = piVar38;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014ddc6e:
                      if ((*(code **)(local_26e0 + 0x10) != (code *)0x0) &&
                         (((*local_26e0 & 2) != 0 ||
                          ((*(byte *)(local_2640._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (**(code **)(local_26e0 + 0x10))(&local_2670);
                        piVar38 = (int *)local_2680._0_8_;
                        uVar39 = local_2700;
                        context = local_26e8;
                        ray = local_26f0;
                        if (*local_2670.valid == 0) goto LAB_014ddd2b;
                      }
                      (((Vec3f *)((long)local_2670.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2670.hit;
                      (((Vec3f *)((long)local_2670.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2670.hit + 4);
                      (((Vec3f *)((long)local_2670.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2670.hit + 8);
                      *(float *)((long)local_2670.ray + 0x3c) = *(float *)(local_2670.hit + 0xc);
                      *(float *)((long)local_2670.ray + 0x40) = *(float *)(local_2670.hit + 0x10);
                      *(float *)((long)local_2670.ray + 0x44) = *(float *)(local_2670.hit + 0x14);
                      *(float *)((long)local_2670.ray + 0x48) = *(float *)(local_2670.hit + 0x18);
                      *(float *)((long)local_2670.ray + 0x4c) = *(float *)(local_2670.hit + 0x1c);
                      *(float *)((long)local_2670.ray + 0x50) = *(float *)(local_2670.hit + 0x20);
                    }
                    else {
                      (*pGVar10->intersectionFilterN)(&local_2670);
                      piVar38 = (int *)local_2680._0_8_;
                      uVar39 = local_2700;
                      context = local_26e8;
                      ray = local_26f0;
                      if (*local_2670.valid != 0) goto LAB_014ddc6e;
LAB_014ddd2b:
                      (local_26f0->super_RayK<1>).tfar = (float)local_26c0._0_4_;
                      piVar38 = (int *)local_2680._0_8_;
                      uVar39 = local_2700;
                      context = local_26e8;
                      ray = local_26f0;
                    }
                    *(undefined4 *)(local_2690 + (long)piVar38 * 4) = 0;
                    fVar52 = (ray->super_RayK<1>).tfar;
                    auVar63._4_4_ = fVar52;
                    auVar63._0_4_ = fVar52;
                    auVar63._8_4_ = fVar52;
                    auVar63._12_4_ = fVar52;
                    auVar90 = vcmpps_avx(local_26b0,auVar63,2);
                    local_2690 = vandps_avx(auVar90,local_2690);
                    local_26c0._0_4_ = (ray->super_RayK<1>).tfar;
                    local_26c0._4_4_ = (ray->super_RayK<1>).mask;
                    local_26c0._8_4_ = (ray->super_RayK<1>).id;
                    local_26c0._12_4_ = (ray->super_RayK<1>).flags;
                    uVar31 = vextractps_avx(local_26c0,1);
                  }
                  if ((((local_2690 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2690 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2690 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2690[0xf]) break;
                  local_26e0._0_4_ = uVar31;
                  BVHNIntersector1<8,1048576,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_2670);
                  piVar38 = local_2670.valid;
                  uVar39 = local_2700;
                  context = local_26e8;
                  ray = local_26f0;
                  uVar31 = (uint)local_26e0;
                } while( true );
              }
            }
            local_26c8 = local_26c8 + 1;
          } while (local_26c8 != local_2628);
        }
        fVar52 = (ray->super_RayK<1>).tfar;
        auVar49 = ZEXT3264(CONCAT428(fVar52,CONCAT424(fVar52,CONCAT420(fVar52,CONCAT416(fVar52,
                                                  CONCAT412(fVar52,CONCAT48(fVar52,CONCAT44(fVar52,
                                                  fVar52))))))));
        auVar159 = ZEXT3264(local_23e0);
        auVar164 = ZEXT3264(local_2400);
        auVar169 = ZEXT3264(local_2420);
        auVar175 = ZEXT3264(local_2440);
        auVar183 = ZEXT3264(local_2460);
        auVar191 = ZEXT3264(local_2480);
        uVar28 = local_26f8;
      }
    } while (pauVar26 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }